

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall
QApplicationPrivate::notifyActiveWindowChange(QApplicationPrivate *this,QWindow *previous)

{
  ulong uVar1;
  undefined1 *puVar2;
  bool bVar3;
  QWidget *pQVar4;
  QWidgetWindow *pQVar5;
  QObject *in_RSI;
  long in_FS_OFFSET;
  QWidget *unaff_retaddr;
  QWidget *widget;
  QWidgetWindow *widgetWindow;
  QWidget *focusWidget;
  QWindow *focusWindow;
  QEvent ae;
  QEvent de;
  char *in_stack_ffffffffffffff98;
  QWidget *this_00;
  QWidget *pQVar6;
  QEvent local_28 [4];
  QWidget *in_stack_ffffffffffffffe0;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = inPopupMode();
  if (!bVar3) {
    this_00 = QGuiApplicationPrivate::focus_window;
    pQVar4 = qt_tlw_for_window((QWindow *)QGuiApplicationPrivate::focus_window);
    setActiveWindow(unaff_retaddr);
    pQVar6 = this_00;
    if (((((this_00 != (QWidget *)0x0) && (pQVar4 != (QWidget *)0x0)) &&
         (pQVar4 = (QWidget *)QWidget::windowHandle(this_00), this_00 != pQVar4)) &&
        ((pQVar5 = qobject_cast<QWidgetWindow*>((QObject *)0x2ce707), pQVar5 != (QWidgetWindow *)0x0
         && (pQVar4 = QWidgetWindow::widget((QWidgetWindow *)0x2ce71e), pQVar4 != (QWidget *)0x0))))
       && (bVar3 = QObject::inherits(&this_00->super_QObject,in_stack_ffffffffffffff98),
          puVar2 = _local_28, bVar3)) {
      uVar1 = (ulong)_local_28 >> 0x20;
      QWidget::setFocus(in_stack_ffffffffffffffe0,(FocusReason)uVar1);
      _local_28 = puVar2;
    }
    if ((in_RSI != (QObject *)0x0) &&
       (pQVar5 = qobject_cast<QWidgetWindow*>((QObject *)0x2ce769), pQVar5 == (QWidgetWindow *)0x0))
    {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_18,WindowDeactivate);
      QCoreApplication::sendEvent(in_RSI,(QEvent *)&local_18);
      QEvent::~QEvent((QEvent *)&local_18);
    }
    if ((pQVar6 != (QWidget *)0x0) &&
       (pQVar5 = qobject_cast<QWidgetWindow*>((QObject *)0x2ce7c1), pQVar5 == (QWidgetWindow *)0x0))
    {
      _local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent(local_28,WindowActivate);
      QCoreApplication::sendEvent(&pQVar6->super_QObject,local_28);
      QEvent::~QEvent(local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::notifyActiveWindowChange(QWindow *previous)
{
#ifndef Q_OS_MACOS
    // Some delayed focus event to ignore, unless we are on cocoa where
    // popups can be opened via right-click on inactive applications
    if (inPopupMode())
        return;
#endif
    QWindow *focusWindow = QGuiApplicationPrivate::focus_window;
    QWidget *focusWidget = qt_tlw_for_window(focusWindow);
    QApplicationPrivate::setActiveWindow(focusWidget);
    // QTBUG-37126, Active X controls may set the focus on native child widgets.
    if (focusWindow && focusWidget && focusWindow != focusWidget->windowHandle()) {
        if (QWidgetWindow *widgetWindow = qobject_cast<QWidgetWindow *>(focusWindow))
            if (QWidget *widget = widgetWindow->widget())
                if (widget->inherits("QAxHostWidget"))
                    widget->setFocus(Qt::ActiveWindowFocusReason);
    }

    // QApplication::setActiveWindow() will deliver window activation events for
    // QWidgetWindows. But for other subclasses of QWindow (like QQuickWindow), we
    // need to send them explicitly, like we do from the base class implementation.
    if (previous && !qobject_cast<QWidgetWindow *>(previous)) {
        QEvent de(QEvent::WindowDeactivate);
        QCoreApplication::sendEvent(previous, &de);
    }

    if (focusWindow && !qobject_cast<QWidgetWindow *>(focusWindow)) {
        QEvent ae(QEvent::WindowActivate);
        QCoreApplication::sendEvent(focusWindow, &ae);
    }

    // don't call base class to avoid double delivery of WindowActivate/Deactivate events
}